

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O0

bool __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::IsEmpty(SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  bool bVar1;
  element_type *__m;
  lock_guard<std::recursive_mutex> local_18;
  Lock l;
  SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  l._M_device = (mutex_type *)this;
  __m = std::__shared_ptr_access<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)&this->_mutex);
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_18,__m);
  bVar1 = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->_map);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_18);
  return bVar1;
}

Assistant:

virtual bool IsEmpty() const
    {
        Lock l(*_mutex);
        return _map.empty();
    }